

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v8::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  size_t count;
  ulong uVar13;
  char *__s;
  char format [7];
  
  uVar8 = 5;
  if (-1 < precision) {
    uVar8 = precision - 1;
  }
  bVar9 = specs._4_1_;
  if (1 < bVar9) {
    uVar8 = precision;
  }
  format[0] = '%';
  uVar10 = specs._4_4_;
  if (bVar9 == 3 && (uVar10 >> 0x14 & 1) != 0) {
    pbVar5 = (byte *)(format + 2);
    format[1] = '#';
  }
  else {
    pbVar5 = (byte *)(format + 1);
  }
  if (-1 < (int)uVar8) {
    pbVar5[0] = 0x2e;
    pbVar5[1] = 0x2a;
    pbVar5 = pbVar5 + 2;
  }
  if (bVar9 == 3) {
    bVar7 = ((uVar10 >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar7 = (bVar9 == 2) + 0x65;
  }
  *pbVar5 = bVar7;
  pbVar5[1] = 0;
  sVar2 = buf->size_;
LAB_0012d5c6:
  while( true ) {
    __s = buf->ptr_ + sVar2;
    uVar12 = buf->capacity_ - sVar2;
    if ((int)uVar8 < 0) {
      uVar4 = snprintf(__s,uVar12,format,value);
    }
    else {
      uVar4 = snprintf(__s,uVar12,format,value,(ulong)uVar8);
    }
    count = (size_t)uVar4;
    if ((int)uVar4 < 0) goto LAB_0012d620;
    if (count < uVar12) break;
    uVar12 = count + sVar2 + 1;
    if (buf->capacity_ < uVar12) goto LAB_0012d62d;
  }
  if (bVar9 == 2) {
    if (precision != 0) {
      uVar12 = 1;
      do {
        lVar6 = uVar12 + (count - 2);
        uVar12 = uVar12 - 1;
      } while ((byte)(__s[lVar6] - 0x30U) < 10);
      memmove(__s + uVar12 + count + -1,__s + uVar12 + count,(ulong)(uint)-(int)uVar12);
      buffer<char>::try_resize(buf,(ulong)(uVar4 - 1));
      goto LAB_0012d72c;
    }
  }
  else {
    if ((uVar10 & 0xff) != 3) {
      lVar6 = -2;
      uVar12 = count - 1;
      do {
        uVar13 = uVar12;
        lVar6 = lVar6 + 1;
        uVar12 = uVar13 - 1;
      } while (__s[uVar13] != 'e');
      lVar6 = -lVar6;
      iVar11 = 0;
      do {
        iVar11 = iVar11 * 10 + (int)__s[lVar6 + count] + -0x30;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0);
      iVar3 = -iVar11;
      if (__s[uVar13 + 1] != '-') {
        iVar3 = iVar11;
      }
      if (uVar12 == 0) {
        uVar12 = 0;
      }
      else {
        do {
          pcVar1 = __s + uVar12;
          uVar12 = uVar12 - 1;
        } while (*pcVar1 == '0');
        memmove(__s + 1,__s + 2,uVar12 & 0xffffffff);
      }
      buffer<char>::try_resize(buf,sVar2 + 1 + (uVar12 & 0xffffffff));
      uVar12 = (ulong)(uint)(iVar3 - (int)uVar12);
      goto LAB_0012d72c;
    }
    count = sVar2 + count;
  }
  buffer<char>::try_resize(buf,count);
  uVar12 = 0;
LAB_0012d72c:
  return (int)uVar12;
LAB_0012d620:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar12 = buf->capacity_ + 1;
LAB_0012d62d:
    (**buf->_vptr_buffer)(buf,uVar12);
  }
  goto LAB_0012d5c6;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    FMT_ASSERT(sign == '+' || sign == '-', "");
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      FMT_ASSERT(is_digit(*p), "");
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}